

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrowableArray.h
# Opt level: O0

char ** Corrade::Containers::
        arrayAppend<char_const*,Corrade::Containers::ArrayMallocAllocator<char_const*>>
                  (Array<const_char_*,_void_(*)(const_char_**,_unsigned_long)> *array,type *value)

{
  char **ppcVar1;
  size_t sVar2;
  ostream *output;
  char **it;
  Flags local_41;
  Error local_40;
  type *local_18;
  type *value_local;
  Array<const_char_*,_void_(*)(const_char_**,_unsigned_long)> *array_local;
  
  local_18 = value;
  value_local = (type *)array;
  ppcVar1 = Array<const_char_*,_void_(*)(const_char_**,_unsigned_long)>::data(array);
  sVar2 = arrayCapacity<char_const*,Corrade::Containers::ArrayMallocAllocator<char_const*>>
                    ((Array<const_char_*,_void_(*)(const_char_**,_unsigned_long)> *)value_local);
  if ((ulong)((long)value - (long)ppcVar1 >> 3) < sVar2) {
    output = Utility::Error::defaultOutput();
    EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_41);
    Utility::Error::Error(&local_40,output,local_41);
    Utility::Debug::operator<<
              (&local_40.super_Debug,
               "Containers::arrayAppend(): use the list variant to append values from within the array itself"
              );
    Utility::Error::~Error(&local_40);
    abort();
  }
  ppcVar1 = Implementation::
            arrayGrowBy<char_const*,Corrade::Containers::ArrayMallocAllocator<char_const*>>
                      ((Array<const_char_*,_void_(*)(const_char_**,_unsigned_long)> *)value_local,1)
  ;
  *ppcVar1 = *local_18;
  return ppcVar1;
}

Assistant:

inline T& arrayAppend(Array<T>& array, const typename std::common_type<T>::type& value) {
    CORRADE_DEBUG_ASSERT(std::size_t(&value - array.data()) >= arrayCapacity(array),
        "Containers::arrayAppend(): use the list variant to append values from within the array itself", *array.data());
    T* const it = Implementation::arrayGrowBy<T, Allocator>(array, 1);
    /* Can't use {}, see the GCC 4.8-specific overload for details */
    #if defined(CORRADE_TARGET_GCC) && !defined(CORRADE_TARGET_CLANG) &&  __GNUC__ < 5
    Implementation::construct(*it, value);
    #else
    new(it) T{value};
    #endif
    return *it;
}